

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

int ON_CompareKnotVector
              (int orderA,int cv_countA,double *knotA,int orderB,int cv_countB,double *knotB)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (orderA < orderB) {
    return -1;
  }
  if (orderA <= orderB) {
    if (cv_countA < cv_countB) {
      return -1;
    }
    if (cv_countA <= cv_countB) {
      if (orderA < 2) {
        return -1;
      }
      if (knotA == (double *)0x0 || cv_countA < orderA) {
        return -1;
      }
      uVar4 = (orderA + cv_countA) - 2;
      dVar6 = ON_DomainTolerance(knotA[(ulong)(uint)orderA - 2],knotA[(ulong)(uint)cv_countA - 1]);
      uVar5 = 0;
      uVar3 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar3 = uVar5;
      }
      do {
        if (uVar3 == uVar5) {
          return 0;
        }
        dVar1 = knotA[uVar5];
        dVar2 = knotB[uVar5];
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (dVar1 < dVar2 - dVar6) {
            return -1;
          }
          if (dVar2 < dVar1 - dVar6) {
            return 1;
          }
          dVar7 = ON_KnotTolerance(orderA,cv_countA,knotA,(int)uVar5);
          dVar8 = ON_KnotTolerance(orderB,cv_countB,knotB,(int)uVar5);
          dVar7 = (double)(~-(ulong)(dVar7 <= dVar8) & (ulong)dVar8 |
                          (ulong)dVar7 & -(ulong)(dVar7 <= dVar8));
          if (dVar1 < dVar2 - dVar7) {
            return -1;
          }
          if (dVar2 < dVar1 - dVar7) {
            return 1;
          }
        }
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  return 1;
}

Assistant:

int ON_CompareKnotVector( // returns 
                                      // -1: first < second
                                      //  0: first == second
                                      // +1: first > second
          int orderA,
          int cv_countA,
          const double* knotA,
          int orderB,
          int cv_countB,
          const double* knotB
          )
{
  const int knot_count = ON_KnotCount(orderA,cv_countA);
  int i;
  double a, b, atol, btol, ktol, tol;
  if ( orderA < orderB )
    return -1;
  if ( orderA > orderB )
    return 1;
  if ( cv_countA < cv_countB )
    return -1;
  if ( cv_countA > cv_countB )
    return 1;

  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return -1;
  atol = ON_DomainTolerance( a, b );
  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return 1;
  btol = ON_DomainTolerance( a, b );
  tol = (atol <= btol) ? atol : btol;

  for ( i = 0; i < knot_count; i++ ) {
    a = knotA[i];
    b = knotB[i];
    if ( a == b )
      continue;
    if ( a < b-tol )
      return -1;
    if ( b < a-tol )
      return 1;
    atol = ON_KnotTolerance( orderA, cv_countA, knotA, i );
    btol = ON_KnotTolerance( orderB, cv_countB, knotB, i );
    ktol = (atol <= btol) ? atol : btol;
    if ( a < b-ktol )
      return -1;
    if ( b < a-ktol )
      return 1;
  }
  return 0;
}